

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmResourceULT.cpp
# Opt level: O3

void __thiscall CTestResource_TestMSAA_Test::TestBody(CTestResource_TestMSAA_Test *this)

{
  int iVar1;
  _Tuple_impl<5UL,_int> _Var2;
  double dVar3;
  CTestResource_TestMSAA_Test *pCVar4;
  pointer ptVar5;
  ulong uVar6;
  CTestResource_TestMSAA_Test *pCVar7;
  GMM_RESOURCE_INFO *ResourceInfo;
  GMM_RESOURCE_INFO *ResourceInfo_00;
  byte bVar8;
  int iVar9;
  uint uVar10;
  undefined1 auVar11 [8];
  int iVar12;
  uint uVar13;
  uint32_t uVar14;
  TEST_MSAA MSAA;
  ulong uVar15;
  undefined1 auStack_138 [8];
  vector<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>
  List;
  GMM_RESCREATE_PARAMS local_108;
  ulong local_80;
  uint32_t local_78;
  uint local_74;
  uint32_t ExpectedMCSBpp;
  GMM_RESOURCE_INFO *local_68;
  uint32_t local_5c;
  uint32_t local_58;
  uint32_t MCSHAlign;
  uint32_t MCSVAlign;
  uint32_t local_48;
  uint32_t local_44;
  uint32_t VAlign;
  uint32_t TileDimY;
  uint32_t HAlign;
  byte local_31;
  uint32_t TileDimX;
  
  auStack_138 = (undefined1  [8])0x0;
  List.
  super__Vector_base<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  List.
  super__Vector_base<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  BuildInputIterator((vector<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>
                      *)auStack_138,3,2,false);
  ptVar5 = List.
           super__Vector_base<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pCVar7 = this;
  auVar11 = auStack_138;
  uVar6 = local_80;
  pCVar4 = _MCSVAlign;
  do {
    _MCSVAlign = pCVar7;
    if (auVar11 == (undefined1  [8])ptVar5) {
      if (auStack_138 != (undefined1  [8])0x0) {
        local_80 = uVar6;
        _MCSVAlign = pCVar4;
        operator_delete((void *)auStack_138);
      }
      return;
    }
    _Var2.super__Head_base<5UL,_int,_false>._M_head_impl =
         (((pointer)auVar11)->super__Tuple_impl<0UL,_int,_int,_int,_bool,_int,_int>).
         super__Tuple_impl<1UL,_int,_int,_bool,_int,_int>.
         super__Tuple_impl<2UL,_int,_bool,_int,_int>.super__Tuple_impl<3UL,_bool,_int,_int>.
         super__Tuple_impl<4UL,_int,_int>.super__Tuple_impl<5UL,_int>.
         super__Head_base<5UL,_int,_false>;
    List.
    super__Vector_base<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)(long)(((pointer)auVar11)->super__Tuple_impl<0UL,_int,_int,_int,_bool,_int,_int>).
                        super__Tuple_impl<1UL,_int,_int,_bool,_int,_int>.
                        super__Tuple_impl<2UL,_int,_bool,_int,_int>.
                        super__Tuple_impl<3UL,_bool,_int,_int>.super__Tuple_impl<4UL,_int,_int>.
                        super__Head_base<4UL,_int,_false>._M_head_impl;
    local_31 = (((pointer)auVar11)->super__Tuple_impl<0UL,_int,_int,_int,_bool,_int,_int>).
               super__Tuple_impl<1UL,_int,_int,_bool,_int,_int>.
               super__Tuple_impl<2UL,_int,_bool,_int,_int>.super__Tuple_impl<3UL,_bool,_int,_int>.
               super__Head_base<3UL,_bool,_false>._M_head_impl;
    uVar10 = (((pointer)auVar11)->super__Tuple_impl<0UL,_int,_int,_int,_bool,_int,_int>).
             super__Tuple_impl<1UL,_int,_int,_bool,_int,_int>.super__Head_base<1UL,_int,_false>.
             _M_head_impl;
    local_80 = (ulong)uVar10;
    TileDimY = (((pointer)auVar11)->super__Tuple_impl<0UL,_int,_int,_int,_bool,_int,_int>).
               super__Head_base<0UL,_int,_false>._M_head_impl;
    local_108.pPreallocatedResInfo = (GMM_RESOURCE_INFO *)0x0;
    local_108.MultiTileArch._0_1_ = 0;
    local_108.MultiTileArch.GpuVaMappingSet = '\0';
    local_108.MultiTileArch.LocalMemEligibilitySet = '\0';
    local_108.MultiTileArch.LocalMemPreferredSet = '\0';
    local_108.MultiTileArch.Reserved = 0;
    local_108.ExistingSysMemSize = 0;
    local_108.MaximumRenamingListLength = 0;
    local_108.NoGfxMemory = '\0';
    local_108._109_3_ = 0;
    local_108.RotateInfo = 0;
    local_108._84_4_ = 0;
    local_108.pExistingSysMem = 0;
    local_108.MaxLod = 0;
    local_108.ArraySize = 0;
    local_108.BaseAlignment = 0;
    local_108.OverridePitch = 0;
    local_108.field_6.BaseWidth64 = 0;
    local_108.BaseHeight = 0;
    local_108.Depth = 0;
    local_108.MSAA.NumSamples = 0;
    local_108.Usage = GMM_RESOURCE_USAGE_UNKNOWN;
    local_108.CpTag = 0;
    local_108._44_4_ = 0;
    local_108.Flags.Info = (anon_struct_8_44_94931171_for_Info)0x0;
    local_108.Flags.Wa = (anon_struct_4_14_9f1eeba6_for_Wa)0x0;
    local_108.MSAA.SamplePattern = GMM_MSAA_DISABLED;
    local_108.Type = RESOURCE_INVALID;
    local_108.Format = GMM_FORMAT_INVALID;
    local_108.Flags.Gpu = (anon_struct_8_45_9b07292e_for_Gpu)0x0;
    if (((int)TileDimY < 3 &&
         (((pointer)auVar11)->super__Tuple_impl<0UL,_int,_int,_int,_bool,_int,_int>).
         super__Tuple_impl<1UL,_int,_int,_bool,_int,_int>.
         super__Tuple_impl<2UL,_int,_bool,_int,_int>.super__Head_base<2UL,_int,_false>._M_head_impl
         == 1) &&
       ((uVar15 = 0x800000, (local_31 & 1) != 0 ||
        ((TileDimY != TEST_TILEX && (uVar15 = 0x40, uVar10 - 1 < 2)))))) {
      CTestResource::SetTileFlag(&this->super_CTestResource,&local_108,TileDimY);
      local_108.Flags.Gpu =
           (anon_struct_8_45_9b07292e_for_Gpu)
           ((ulong)local_108.Flags.Gpu & 0xffffffffff7fffbf | uVar15);
      local_108.ArraySize =
           *(uint32_t *)
            (&DAT_001a83c8 + (long)(int)_Var2.super__Head_base<5UL,_int,_false>._M_head_impl * 4);
      local_108.NoGfxMemory = '\x01';
      local_108.Format = GMM_FORMAT_INVALID;
      if ((uint)local_80 < 5) {
        local_108.Format = (&DAT_001a85f0)[local_80];
      }
      _ExpectedMCSBpp = (double)(long)local_80;
      local_108.Type = RESOURCE_2D;
      MSAA = MSAA_2x;
      local_74 = local_31 & 1;
      do {
        CTestResource::GetAlignmentAndTileDimensionsForMSAA
                  (&this->super_CTestResource,(TEST_BPP)local_80,SUB41(local_74,0),TileDimY,MSAA,
                   &HAlign,&local_44,&VAlign,&local_48,&local_78,&local_5c,&local_58);
        local_108.field_6.BaseWidth =
             HAlign * *(int *)(&DAT_001a83b0 +
                              (long)List.
                                    super__Vector_base<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage * 8) + 1;
        local_108.field_6.BaseWidth64._4_4_ = 0;
        local_108.Depth = 1;
        local_108.BaseHeight =
             local_44 *
             *(int *)(&DAT_001a83b4 +
                     (long)List.
                           super__Vector_base<std::tuple<int,_int,_int,_bool,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_bool,_int,_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage * 8) + 1;
        MCSHAlign = MSAA;
        dVar3 = exp2((double)(int)MSAA);
        local_108.MSAA.NumSamples = (uint32_t)(long)dVar3;
        local_108.Flags.Gpu =
             (anon_struct_8_45_9b07292e_for_Gpu)((ulong)local_108.Flags.Gpu & 0xffffffffffff7fff);
        local_108.ArraySize = 1;
        ResourceInfo = (GMM_RESOURCE_INFO *)
                       (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                                 (CommonULT::pGmmULTClientContext,&local_108);
        if (ResourceInfo != (GMM_RESOURCE_INFO *)0x0) {
          CTestResource::VerifyResourceHAlign<true>(&this->super_CTestResource,ResourceInfo,VAlign);
          CTestResource::VerifyResourceVAlign<true>
                    (&this->super_CTestResource,ResourceInfo,local_48);
          if ((local_31 & 1) == 0) {
            iVar9 = 2;
            if (MCSHAlign == 1) {
              bVar8 = 0;
LAB_0017c570:
              local_108.field_6.BaseWidth64 = local_108.field_6.BaseWidth64 + 1 & 0xfffffffffffffffe
              ;
              local_68 = (GMM_RESOURCE_INFO *)(ulong)(bVar8 + 1);
              uVar14 = local_108.BaseHeight + 1 & 0xfffffffe;
              if (bVar8 == 0) {
                uVar14 = local_108.BaseHeight;
              }
            }
            else {
              if (MCSHAlign == 3) {
                bVar8 = 1;
                iVar9 = 4;
                goto LAB_0017c570;
              }
              if (MCSHAlign == 2) {
                bVar8 = 1;
                goto LAB_0017c570;
              }
              local_68 = (GMM_RESOURCE_INFO *)0x1;
              iVar9 = 1;
              uVar14 = local_108.BaseHeight;
            }
            local_108.BaseHeight = uVar14;
            uVar14 = local_108.field_6.BaseWidth;
            iVar1 = VAlign - 1;
            uVar10 = -VAlign;
            dVar3 = exp2(_ExpectedMCSBpp);
            iVar12 = (int)(long)dVar3 * (uVar10 & iVar1 + uVar14 * iVar9) + HAlign;
            iVar9 = iVar9 * local_108.field_6.BaseWidth;
            iVar1 = VAlign - 1;
            uVar10 = -VAlign;
            dVar3 = exp2(_ExpectedMCSBpp);
            pCVar4 = _MCSVAlign;
            uVar14 = ~((int)(long)dVar3 * (uVar10 & iVar1 + iVar9) + -1 + HAlign & HAlign - 1) +
                     iVar12;
            CTestResource::VerifyResourcePitch<true>
                      (&_MCSVAlign->super_CTestResource,ResourceInfo,uVar14);
            if (TileDimY != 0) {
              CTestResource::VerifyResourcePitchInTiles<true>
                        (&pCVar4->super_CTestResource,ResourceInfo,uVar14 / HAlign);
            }
            uVar10 = -local_48 & (local_48 - 1) + (int)local_68 * local_108.BaseHeight;
            if (1 < local_108.ArraySize) {
              CTestResource::VerifyResourceQPitch<true>
                        (&_MCSVAlign->super_CTestResource,ResourceInfo,(ulong)uVar10);
            }
            this = _MCSVAlign;
            CTestResource::VerifyResourceSize<true>
                      (&_MCSVAlign->super_CTestResource,ResourceInfo,
                       (ulong)((-local_44 & (local_44 - 1) + local_108.ArraySize * uVar10) * uVar14
                               + 0xfff & 0xfffff000));
          }
          else {
            uVar10 = (VAlign - 1) + local_108.field_6.BaseWidth;
            uVar13 = -VAlign;
            dVar3 = exp2(_ExpectedMCSBpp);
            iVar9 = (int)(long)dVar3 * (uVar13 & uVar10) + HAlign;
            uVar10 = (VAlign - 1) + local_108.field_6.BaseWidth;
            uVar13 = -VAlign;
            dVar3 = exp2(_ExpectedMCSBpp);
            uVar14 = ~((int)(long)dVar3 * (uVar13 & uVar10) + -1 + HAlign & HAlign - 1) + iVar9;
            CTestResource::VerifyResourcePitch<true>(&this->super_CTestResource,ResourceInfo,uVar14)
            ;
            if (TileDimY != 0) {
              CTestResource::VerifyResourcePitchInTiles<true>
                        (&this->super_CTestResource,ResourceInfo,uVar14 / HAlign);
            }
            uVar10 = -local_48 & (local_108.BaseHeight - 1) + local_48;
            CTestResource::VerifyResourceQPitch<true>
                      (&this->super_CTestResource,ResourceInfo,(ulong)uVar10);
            CTestResource::VerifyResourceSize<true>
                      (&this->super_CTestResource,ResourceInfo,
                       (ulong)((-local_44 &
                               (local_44 - 1) +
                               uVar10 * local_108.MSAA.NumSamples * local_108.ArraySize) * uVar14 +
                               0xfff & 0xfffff000));
          }
          local_108.Flags.Gpu =
               (anon_struct_8_45_9b07292e_for_Gpu)((ulong)local_108.Flags.Gpu | 0x8000);
          ResourceInfo_00 =
               (GMM_RESOURCE_INFO *)
               (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                         (CommonULT::pGmmULTClientContext,&local_108);
          CTestResource::VerifyResourceHAlign<true>
                    (&this->super_CTestResource,ResourceInfo_00,local_5c);
          CTestResource::VerifyResourceVAlign<true>
                    (&this->super_CTestResource,ResourceInfo_00,local_58);
          uVar10 = (-local_5c & (local_5c - 1) + local_108.field_6.BaseWidth) * local_78 + 0x7f;
          uVar13 = uVar10 & 0xffffff80;
          local_68 = ResourceInfo;
          CTestResource::VerifyResourcePitch<true>
                    (&this->super_CTestResource,ResourceInfo_00,uVar13);
          CTestResource::VerifyResourcePitchInTiles<true>
                    (&this->super_CTestResource,ResourceInfo_00,uVar10 >> 7);
          uVar14 = local_108.BaseHeight;
          if (1 < local_108.ArraySize) {
            uVar14 = -local_58 & (local_108.BaseHeight - 1) + local_58;
            CTestResource::VerifyResourceQPitch<true>
                      (&_MCSVAlign->super_CTestResource,ResourceInfo_00,(ulong)uVar14);
          }
          this = _MCSVAlign;
          CTestResource::VerifyResourceSize<true>
                    (&_MCSVAlign->super_CTestResource,ResourceInfo_00,
                     (ulong)((local_108.ArraySize * uVar14 + 0x1f & 0xffffffe0) * uVar13));
          ResourceInfo = local_68;
          (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
                    (CommonULT::pGmmULTClientContext,ResourceInfo_00);
        }
        (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
                  (CommonULT::pGmmULTClientContext,ResourceInfo);
        MSAA = MCSHAlign + MSAA_2x;
        uVar6 = local_80;
      } while (MSAA != MSAA_16x);
    }
    local_80 = uVar6;
    auVar11 = (undefined1  [8])((long)auVar11 + 0x18);
    pCVar7 = _MCSVAlign;
    uVar6 = local_80;
    pCVar4 = _MCSVAlign;
  } while( true );
}

Assistant:

TEST_F(CTestResource, TestMSAA)
{
    enum MSAA_Samples
    {
        MSAA_None,
        MSAA_2x,
        MSAA_4x,
        MSAA_8x,
        MSAA_16x
    };

    const uint32_t MCSTileSize[1][2] = {128, 32}; //MCS is TileY

    //Gen8:No mip-map for MSAA (MSS and MCS), No 16x
    //No MSAA for YUV/compressed formats
    //Interleaved MSS (IMS) for Depth/Stencil. Arrayed MSS (CMS) for Color RT
    //QPitch exists for arrayed MSS - gives distance between slices
    //MSS (Arrayed): px_wL, px_hL = pixel width/height of single sample at Lod L
    //                 MSS width = px_wL, MSS height = NumSamples*px_hL
    //MSS (Interleaved): px_wL, px_hL = pixel width/height of single sample at Lod L
    // Samples         MSS width                MSS Height
    //   2x            4*ceil(px_wL/2)             px_hL
    //   4x            4*ceil(px_wL/2)           4*ceil(px_hL/2)
    //   8x            8*ceil(px_wL/2)           4*ceil(px_hL/2)
    //  16x            8*ceil(px_wL/2)           8*ceil(px_hL/2)
    //MCS (bpp): 2x/4x - bpp_8, 8x - bpp_32, 16x - bpp_64

    const uint32_t TestDimensions[3][2] = {
    {0, 0}, //1x1x1
    {1, 0}, //2 Tilesx1
    {1, 1}, //2 Tilesx 2
    };

    uint32_t TestArraySize[2] = {1, 7};

    uint32_t HAlign, VAlign, TileDimX, TileDimY, MCSHAlign, MCSVAlign, TileSize;
    uint32_t ExpectedMCSBpp;

    std::vector<std::tuple<int, int, int, bool, int, int>> List; //TEST_TILE_TYPE, TEST_BPP, TEST_RESOURCE_TYPE, Depth or RT, TestDimension index, TestArraySize index
    auto Size = BuildInputIterator(List, 3, 2, false);                  // Size of arrays TestDimensions, TestArraySize

    for(auto element : List)
    {
        GMM_RESCREATE_PARAMS gmmParams = {};
        gmmParams.Flags.Info           = {0};

        TEST_TILE_TYPE     Tiling     = (TEST_TILE_TYPE)std::get<0>(element);
        TEST_BPP           Bpp        = (TEST_BPP)std::get<1>(element);
        TEST_RESOURCE_TYPE ResType    = (TEST_RESOURCE_TYPE)std::get<2>(element);
        bool               IsRT       = std::get<3>(element); // True for RT, False for Depth
        int                TestDimIdx = std::get<4>(element); //index into TestDimensions array
        int                ArrayIdx   = std::get<5>(element); //index into TestArraySize
        TileSize                      = GMM_KBYTE(4);

        //Discard un-supported Tiling/Res_type/bpp for this test
        if(ResType != TEST_RESOURCE_2D || Tiling > TEST_TILEY           //No 1D/3D/Cube. Supported 2D mip-maps/array
           || (!IsRT && (Tiling == TEST_TILEX ||
                         !(Bpp == TEST_BPP_16 || Bpp == TEST_BPP_32)))) //depth supported on 16bit, 32bit formats only
            continue;

        SetTileFlag(gmmParams, Tiling);
        SetResType(gmmParams, ResType);
        SetResGpuFlags(gmmParams, IsRT);
        SetResArraySize(gmmParams, TestArraySize[ArrayIdx]);

        gmmParams.NoGfxMemory = 1;
        gmmParams.Format      = SetResourceFormat(Bpp);
        for(uint32_t k = MSAA_2x; k < MSAA_16x; k++) //No 16x MSAA on Gen8
        {
            GetAlignmentAndTileDimensionsForMSAA(Bpp, IsRT, Tiling, (TEST_MSAA)k,
                                                 TileDimX, TileDimY, HAlign, VAlign,
                                                 ExpectedMCSBpp, MCSHAlign, MCSVAlign);

            gmmParams.BaseWidth64 = TestDimensions[TestDimIdx][0] * TileDimX + 0x1;
            gmmParams.BaseHeight  = TestDimensions[TestDimIdx][1] * TileDimY + 0x1;

            gmmParams.Depth           = 0x1; //2D Res_type with Depth > 1 doesn't fail, although Tex_cacl doesn't use it
            gmmParams.MSAA.NumSamples = static_cast<uint32_t>(pow((double)2, k));
            gmmParams.Flags.Gpu.MCS   = 0;
            gmmParams.ArraySize       = 1;

            //MSS surface
            GMM_RESOURCE_INFO *MSSResourceInfo;
            MSSResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

            if(MSSResourceInfo)
            {
                VerifyResourceHAlign<true>(MSSResourceInfo, HAlign);
                VerifyResourceVAlign<true>(MSSResourceInfo, VAlign);
                if(IsRT) //Arrayed MSS
                {
                    uint32_t ExpectedPitch = 0, ExpectedQPitch = 0;
                    ExpectedPitch = GMM_ULT_ALIGN(GMM_ULT_ALIGN(gmmParams.BaseWidth64, HAlign) * (uint32_t)pow(2.0, Bpp), TileDimX); // Aligned width * bpp, aligned to TileWidth
                    VerifyResourcePitch<true>(MSSResourceInfo, ExpectedPitch);
                    if(Tiling != TEST_LINEAR)
                        VerifyResourcePitchInTiles<true>(MSSResourceInfo, ExpectedPitch / TileDimX);

                    //if (gmmParams.ArraySize > 1) - Arrayed MSS has QPitch
                    {
                        ExpectedQPitch = GMM_ULT_ALIGN(gmmParams.BaseHeight, VAlign);
                        VerifyResourceQPitch<true>(MSSResourceInfo, ExpectedQPitch);
                    }

                    uint32_t ExpectedHeight = GMM_ULT_ALIGN(ExpectedQPitch * gmmParams.MSAA.NumSamples * gmmParams.ArraySize, TileDimY); //Align Height =ExpectedPitch * NumSamples * ExpectedQPitch, to Tile-Height
                    VerifyResourceSize<true>(MSSResourceInfo, GMM_ULT_ALIGN(ExpectedPitch * ExpectedHeight, TileSize));
                }
                else // Interleaved MSS
                {
                    uint32_t WidthMultiplier, HeightMultiplier;
                    GetInterleaveMSSPattern((TEST_MSAA)k, WidthMultiplier, HeightMultiplier, IsRT, Bpp);
                    gmmParams.BaseWidth64 = WidthMultiplier > 1 ? GMM_ULT_ALIGN(gmmParams.BaseWidth64, 2) : gmmParams.BaseWidth64;
                    gmmParams.BaseHeight  = HeightMultiplier > 1 ? GMM_ULT_ALIGN(gmmParams.BaseHeight, 2) : gmmParams.BaseHeight;

                    uint32_t ExpectedPitch = GMM_ULT_ALIGN(GMM_ULT_ALIGN(gmmParams.BaseWidth64 * WidthMultiplier, HAlign) * (uint32_t)pow(2.0, Bpp), TileDimX); //AlignedWidth*bpp, then align to Tile
                    VerifyResourcePitch<true>(MSSResourceInfo, ExpectedPitch);
                    if(Tiling != TEST_LINEAR)
                    {
                        VerifyResourcePitchInTiles<true>(MSSResourceInfo, ExpectedPitch / TileDimX); // 1 tileY wide
                    }

                    uint32_t ExpectedQPitch = GMM_ULT_ALIGN(gmmParams.BaseHeight * HeightMultiplier, VAlign);
                    if(gmmParams.ArraySize > 1)
                    {
                        // it needs to be in VALign multiple
                        VerifyResourceQPitch<true>(MSSResourceInfo, ExpectedQPitch);
                    }
                    uint32_t ExpectedHeight = GMM_ULT_ALIGN(ExpectedQPitch * gmmParams.ArraySize, TileDimY);            //Align Height = ExpectedQPitch*ArraySize, to Tile-Height
                    VerifyResourceSize<true>(MSSResourceInfo, GMM_ULT_ALIGN(ExpectedPitch * ExpectedHeight, TileSize)); //ExpectedPitch *ExpectedHeight
                }
            }

            //No MCS surface if MSS creation failed
            if(MSSResourceInfo)
            {
                gmmParams.Flags.Gpu.MCS = 1;
                GMM_RESOURCE_INFO *MCSResourceInfo;
                MCSResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

                VerifyResourceHAlign<true>(MCSResourceInfo, MCSHAlign); // MCS alignment same as basic RT alignment
                VerifyResourceVAlign<true>(MCSResourceInfo, MCSVAlign);

                uint32_t ExpectedPitch = GMM_ULT_ALIGN(GMM_ULT_ALIGN(gmmParams.BaseWidth64, MCSHAlign) * ExpectedMCSBpp, MCSTileSize[0][0]); //AlignedWidth*bpp, then tile-alignment
                VerifyResourcePitch<true>(MCSResourceInfo, ExpectedPitch);
                VerifyResourcePitchInTiles<true>(MCSResourceInfo, ExpectedPitch / MCSTileSize[0][0]);

                uint32_t ExpectedQPitch = gmmParams.BaseHeight;
                if(gmmParams.ArraySize > 1)
                {
                    ExpectedQPitch = GMM_ULT_ALIGN(gmmParams.BaseHeight, MCSVAlign); //QPitch only for array
                    VerifyResourceQPitch<true>(MCSResourceInfo, ExpectedQPitch);
                }

                uint32_t ExpectedHeight = GMM_ULT_ALIGN(ExpectedQPitch * gmmParams.ArraySize, MCSTileSize[0][1]);
                VerifyResourceSize<true>(MCSResourceInfo, GMM_ULT_ALIGN(ExpectedPitch * ExpectedHeight, TileSize));

                pGmmULTClientContext->DestroyResInfoObject(MCSResourceInfo);
            } //MCS

            pGmmULTClientContext->DestroyResInfoObject(MSSResourceInfo);
        } //NumSamples = k
    }     //Iterate through all input tuples
}